

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall BloatyTest::~BloatyTest(BloatyTest *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void CheckConsistencyForRow(const bloaty::RollupRow& row, bool is_toplevel,
                             bool diff_mode, int* count) {
    // If any children exist, they should sum up to this row's values.
    // Also none of the children should have the same name.
    std::unordered_set<std::string> names;

    if (row.sorted_children.size() > 0) {
      uint64_t vmtotal = 0;
      uint64_t filetotal = 0;
      for (const auto& child : row.sorted_children) {
        vmtotal += child.size.vm;
        filetotal += child.size.file;
        CheckConsistencyForRow(child, false, diff_mode, count);
        ASSERT_TRUE(names.insert(child.name).second);
        ASSERT_FALSE(child.size.vm == 0 && child.size.file == 0);
      }

      if (!diff_mode) {
        ASSERT_EQ(vmtotal, row.size.vm);
        ASSERT_EQ(filetotal, row.size.file);
      }
    } else {
      // Count leaf rows.
      *count += 1;
    }

    if (!is_toplevel && row.sorted_children.size() == 1) {
      ASSERT_NE(NONE_STRING, row.sorted_children[0].name);
    }
  }